

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O2

void __thiscall
CMU462::Vertex::getNeighborhood
          (Vertex *this,
          map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
          *seen,int depth)

{
  _Rb_tree_header *p_Var1;
  _List_node_base *p_Var2;
  iterator iVar3;
  _List_node_base *p_Var4;
  double dVar5;
  double dVar6;
  double dVar7;
  HalfedgeIter h;
  double dist;
  key_type local_48;
  double local_40;
  double local_38;
  
  if (-1 < depth) {
    p_Var4 = (this->_halfedge)._M_node;
    p_Var1 = &(seen->_M_t)._M_impl.super__Rb_tree_header;
    local_40 = INFINITY;
    do {
      p_Var2 = p_Var4[1]._M_prev[2]._M_prev;
      iVar3 = std::
              _Rb_tree<std::_List_iterator<CMU462::Halfedge>,_std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>,_std::_Select1st<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
              ::find(&seen->_M_t,(key_type *)&p_Var2[0xf]._M_prev);
      if (((_Rb_tree_header *)iVar3._M_node != p_Var1) &&
         (dVar5 = (double)p_Var2[1]._M_prev - (this->position).x,
         dVar6 = (double)p_Var2[2]._M_next - (this->position).y,
         dVar7 = (double)p_Var2[2]._M_prev - (this->position).z,
         dVar5 = SQRT(dVar7 * dVar7 + dVar5 * dVar5 + dVar6 * dVar6) +
                 (double)iVar3._M_node[1]._M_parent, dVar5 <= local_40)) {
        local_40 = dVar5;
      }
      p_Var4 = p_Var4[1]._M_prev[2]._M_next;
    } while ((this->_halfedge)._M_node != p_Var4);
    local_48._M_node = p_Var4;
    local_38 = local_40;
    iVar3 = std::
            _Rb_tree<std::_List_iterator<CMU462::Halfedge>,_std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>,_std::_Select1st<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
            ::find(&seen->_M_t,&local_48);
    if (((_Rb_tree_header *)iVar3._M_node == p_Var1) ||
       (iVar3 = std::
                _Rb_tree<std::_List_iterator<CMU462::Halfedge>,_std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>,_std::_Select1st<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
                ::find(&seen->_M_t,&local_48), local_40 < (double)iVar3._M_node[1]._M_parent)) {
      std::
      _Rb_tree<std::_List_iterator<CMU462::Halfedge>,std::pair<std::_List_iterator<CMU462::Halfedge>const,double>,std::_Select1st<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>,std::less<std::_List_iterator<CMU462::Halfedge>>,std::allocator<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>>
      ::_M_emplace_unique<std::_List_iterator<CMU462::Halfedge>&,double&>
                ((_Rb_tree<std::_List_iterator<CMU462::Halfedge>,std::pair<std::_List_iterator<CMU462::Halfedge>const,double>,std::_Select1st<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>,std::less<std::_List_iterator<CMU462::Halfedge>>,std::allocator<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>>
                  *)seen,&local_48,&local_38);
    }
    local_48._M_node = (this->_halfedge)._M_node;
    do {
      getNeighborhood((Vertex *)(local_48._M_node[1]._M_prev[2]._M_prev + 1),seen,depth + -1);
      local_48._M_node = local_48._M_node[1]._M_prev[2]._M_next;
    } while ((this->_halfedge)._M_node != local_48._M_node);
  }
  return;
}

Assistant:

void Vertex::getNeighborhood(map<HalfedgeIter, double>& seen, int depth) {
  if (depth < 0) return;

  HalfedgeIter h = _halfedge;
  double dist = INF_D;
  do {
    VertexIter u = h->twin()->vertex();
    auto d = seen.find(u->halfedge());
    if (d != seen.end()) {
      dist = std::min(d->second + (u->position - position).norm(), dist);
    }
    h = h->twin()->next();
  } while (h != _halfedge);

  if (seen.find(h) == seen.end() || seen.find(h)->second > dist) {
    seen.emplace(h, dist);
  }

  h = _halfedge;
  do {
    VertexIter u = h->twin()->vertex();
    u->getNeighborhood(seen, depth - 1);
    h = h->twin()->next();
  } while (h != _halfedge);
}